

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_packbits.c
# Opt level: O2

int PackBitsPreEncode(TIFF *tif,uint16_t s)

{
  int iVar1;
  uint8_t *puVar2;
  tmsize_t tVar3;
  
  puVar2 = (uint8_t *)_TIFFmallocExt(tif,8);
  tif->tif_data = puVar2;
  if (puVar2 == (uint8_t *)0x0) {
    iVar1 = 0;
  }
  else {
    if ((tif->tif_flags & 0x400) == 0) {
      tVar3 = TIFFScanlineSize(tif);
    }
    else {
      tVar3 = TIFFTileRowSize(tif);
    }
    *(tmsize_t *)tif->tif_data = tVar3;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int PackBitsPreEncode(TIFF *tif, uint16_t s)
{
    (void)s;

    tif->tif_data = (uint8_t *)_TIFFmallocExt(tif, sizeof(tmsize_t));
    if (tif->tif_data == NULL)
        return (0);
    /*
     * Calculate the scanline/tile-width size in bytes.
     */
    if (isTiled(tif))
        *(tmsize_t *)tif->tif_data = TIFFTileRowSize(tif);
    else
        *(tmsize_t *)tif->tif_data = TIFFScanlineSize(tif);
    return (1);
}